

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O3

int bb_serial_read_open(uint user_gpio,uint baud,uint32_t bbBits)

{
  int iVar1;
  uint32_t bbBits_local;
  gpioExtent_t ext [1];
  
  ext[0].ptr = &bbBits_local;
  ext[0].size = 4;
  bbBits_local = bbBits;
  iVar1 = pigpio_command_ext(gPigCommand,0x2a,user_gpio,baud,4,1,ext,1);
  return iVar1;
}

Assistant:

int bb_serial_read_open(unsigned user_gpio, unsigned baud, uint32_t bbBits)
{
   gpioExtent_t ext[1];
   
   /*
   p1=user_gpio
   p2=baud
   p3=4
   ## extension ##
   unsigned bbBits
   */

   ext[0].size = sizeof(uint32_t);
   ext[0].ptr = &bbBits;

   return pigpio_command_ext(
      gPigCommand, PI_CMD_SLRO, user_gpio, baud, 4, 1, ext, 1);
}